

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  Fad<double> *pFVar8;
  uint uVar9;
  ulong uVar10;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar11;
  value_type vVar12;
  
  pFVar11 = (fadexpr->fadexpr_).left_;
  pFVar8 = (((pFVar11->fadexpr_).left_)->fadexpr_).expr_;
  uVar9 = (pFVar8->dx_).num_elts;
  uVar1 = (((((pFVar11->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar9) {
    uVar1 = uVar9;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00f9ffcb;
    pdVar7 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar7 = (this->dx_).ptr_to_data;
        if (pdVar7 != (double *)0x0) {
          operator_delete__(pdVar7);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00f9ffcb;
    }
    if (uVar2 != 0) {
      pdVar7 = (this->dx_).ptr_to_data;
      if (pdVar7 != (double *)0x0) {
        operator_delete__(pdVar7);
        pFVar11 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar10 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar10 = (ulong)uVar1 << 3;
    }
    pdVar7 = (double *)operator_new__(uVar10);
    (this->dx_).ptr_to_data = pdVar7;
    pFVar8 = (((pFVar11->fadexpr_).left_)->fadexpr_).expr_;
    uVar9 = (pFVar8->dx_).num_elts;
  }
  if (uVar9 != 0) {
    pFVar3 = (pFVar11->fadexpr_).right_;
    pFVar4 = (pFVar3->fadexpr_).right_;
    if ((pFVar4->dx_).num_elts != 0) {
      if (0 < (int)uVar1) {
        pdVar5 = (pFVar8->dx_).ptr_to_data;
        pdVar6 = (pFVar4->dx_).ptr_to_data;
        uVar10 = 0;
        do {
          pdVar7[uVar10] =
               (((pFVar3->fadexpr_).left_.constant_ + pFVar4->val_) * pdVar5[uVar10] +
               pdVar6[uVar10] * pFVar8->val_) / (fadexpr->fadexpr_).right_.constant_;
          uVar10 = uVar10 + 1;
        } while (uVar1 != uVar10);
      }
      goto LAB_00f9ffcb;
    }
  }
  if (0 < (int)uVar1) {
    uVar10 = 0;
    do {
      vVar12 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
               ::dx(&fadexpr->fadexpr_,(int)uVar10);
      pdVar7[uVar10] = vVar12;
      uVar10 = uVar10 + 1;
    } while (uVar1 != uVar10);
  }
LAB_00f9ffcb:
  pFVar11 = (fadexpr->fadexpr_).left_;
  pFVar3 = (pFVar11->fadexpr_).right_;
  this->val_ = (((pFVar3->fadexpr_).left_.constant_ + ((pFVar3->fadexpr_).right_)->val_) *
               ((((pFVar11->fadexpr_).left_)->fadexpr_).expr_)->val_) /
               (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}